

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sgen4.c
# Opt level: O3

void firstSatGroup(int g,int sign)

{
  int iVar1;
  Clause *pCVar2;
  int *piVar3;
  long lVar4;
  int iVar5;
  int iVar6;
  long lVar7;
  long lVar8;
  
  piVar3 = permute;
  pCVar2 = clauseArray;
  if (1 < groupSize) {
    iVar5 = 1;
    lVar7 = 2;
    iVar6 = groupSize;
    do {
      lVar4 = lVar7;
      if (iVar5 < iVar6) {
        do {
          lVar8 = (long)clauseCount;
          clauseCount = clauseCount + 1;
          iVar1 = piVar3[iVar6 * g + iVar5];
          iVar6 = piVar3[iVar6 * g + lVar4];
          pCVar2[lVar8].numOfVariables = 2;
          pCVar2[lVar8].variables[0] = iVar1 * sign;
          pCVar2[lVar8].variables[1] = iVar6 * sign;
          iVar1 = (int)lVar4;
          lVar4 = lVar4 + 1;
          iVar6 = groupSize;
        } while (iVar1 < groupSize);
      }
      iVar5 = iVar5 + 1;
      lVar7 = lVar7 + 1;
    } while (iVar5 < iVar6);
  }
  return;
}

Assistant:

void firstSatGroup (int g, int sign)
{
    int i,j;

    for (i=1;i<groupSize;i++)
        for (j=i+1;j<=groupSize;j++)
            set2Clause (&(clauseArray[clauseCount++]), sign*permute[g*groupSize+i], sign*permute[g*groupSize+j]);

}